

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.h
# Opt level: O0

void Server::remove_from_hook<HTTPResponse*(*)(Client*)>
               (vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>
                *hook,_func_HTTPResponse_ptr_Client_ptr *func)

{
  bool bVar1;
  reference pp_Var2;
  const_iterator local_30;
  __normal_iterator<HTTPResponse_*(**)(Client_*),_std::vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>_>
  local_28;
  __normal_iterator<HTTPResponse_*(**)(Client_*),_std::vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>_>
  local_20;
  iterator i;
  _func_HTTPResponse_ptr_Client_ptr *func_local;
  vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_> *hook_local;
  
  i._M_current = (_func_HTTPResponse_ptr_Client_ptr **)func;
  local_20._M_current =
       (_func_HTTPResponse_ptr_Client_ptr **)
       std::vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>::begin
                 (hook);
  while( true ) {
    local_28._M_current =
         (_func_HTTPResponse_ptr_Client_ptr **)
         std::vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>::end
                   (hook);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) {
      return;
    }
    pp_Var2 = __gnu_cxx::
              __normal_iterator<HTTPResponse_*(**)(Client_*),_std::vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>_>
              ::operator*(&local_20);
    if ((_func_HTTPResponse_ptr_Client_ptr **)*pp_Var2 == i._M_current) break;
    __gnu_cxx::
    __normal_iterator<HTTPResponse_*(**)(Client_*),_std::vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>_>
    ::operator++(&local_20);
  }
  __gnu_cxx::
  __normal_iterator<HTTPResponse*(*const*)(Client*),std::vector<HTTPResponse*(*)(Client*),std::allocator<HTTPResponse*(*)(Client*)>>>
  ::__normal_iterator<HTTPResponse*(**)(Client*)>
            ((__normal_iterator<HTTPResponse*(*const*)(Client*),std::vector<HTTPResponse*(*)(Client*),std::allocator<HTTPResponse*(*)(Client*)>>>
              *)&local_30,&local_20);
  std::vector<HTTPResponse_*(*)(Client_*),_std::allocator<HTTPResponse_*(*)(Client_*)>_>::erase
            (hook,local_30);
  return;
}

Assistant:

static void remove_from_hook(std::vector<T> &hook, T func) {
        for (auto i = hook.begin(); i != hook.end(); ++i) {
            if (*i == func) {
                hook.erase(i);
                return;
            }
        }
    }